

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  cmState *pcVar7;
  string local_1d58 [32];
  undefined1 local_1d38 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_1bb9;
  string local_1bb8;
  cmValue local_1b98;
  cmValue specFile;
  string local_1b88;
  undefined4 local_1b64;
  char *local_1b60;
  char *testFilename;
  Command local_1b48;
  allocator<char> local_1b21;
  string local_1b20;
  allocator<char> local_1af9;
  string local_1af8;
  cmCTestSetTestsPropertiesCommand local_1ad8;
  Command local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  allocator<char> local_1a79;
  string local_1a78;
  allocator<char> local_1a51;
  string local_1a50;
  cmCTestAddTestCommand local_1a30;
  Command local_1a20;
  allocator<char> local_19f9;
  string local_19f8;
  string_view local_19d8;
  allocator<char> local_19c1;
  string local_19c0;
  cmStateSnapshot local_19a0;
  undefined1 local_1988 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  undefined1 local_a38 [8];
  cmake cm;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestTestHandler *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::RegularExpression::compile(&this->IncludeTestsRegularExpression,&this->IncludeRegExp);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::RegularExpression::compile(&this->ExcludeTestsRegularExpression,&this->ExcludeRegExp);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"Constructing a list of tests");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x6f7,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&cm.ProfilingOutput);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  cmake::cmake((cmake *)local_a38,RoleScript,CTest,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a58,"",&local_a59);
  cmake::SetHomeDirectory((cmake *)local_a38,&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator(&local_a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"",&local_a81);
  cmake::SetHomeOutputDirectory((cmake *)local_a38,&local_a80);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_a38);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_a38);
  cmake::GetCurrentSnapshot(&local_19a0,(cmake *)local_a38);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1988,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,&local_19a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19c0,"CTEST_CONFIGURATION_TYPE",&local_19c1);
  psVar6 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  local_19d8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  cmMakefile::AddDefinition((cmMakefile *)local_1988,&local_19c0,local_19d8);
  std::__cxx11::string::~string((string *)&local_19c0);
  std::allocator<char>::~allocator(&local_19c1);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_19f8,"add_test",&local_19f9);
  anon_unknown.dwarf_1d24e4::cmCTestAddTestCommand::cmCTestCommand(&local_1a30,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestAddTestCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_1a20,&local_1a30);
  cmState::AddBuiltinCommand(pcVar7,&local_19f8,&local_1a20);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_1a20);
  anon_unknown.dwarf_1d24e4::cmCTestAddTestCommand::~cmCTestAddTestCommand(&local_1a30);
  std::__cxx11::string::~string((string *)&local_19f8);
  std::allocator<char>::~allocator(&local_19f9);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a50,"subdirs",&local_1a51);
  cmState::AddBuiltinCommand(pcVar7,&local_1a50,anon_unknown.dwarf_1d24e4::cmCTestSubdirCommand);
  std::__cxx11::string::~string((string *)&local_1a50);
  std::allocator<char>::~allocator(&local_1a51);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a78,"add_subdirectory",&local_1a79);
  cmState::AddBuiltinCommand
            (pcVar7,&local_1a78,anon_unknown.dwarf_1d24e4::cmCTestAddSubdirectoryCommand);
  std::__cxx11::string::~string((string *)&local_1a78);
  std::allocator<char>::~allocator(&local_1a79);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1aa0,"set_tests_properties",&local_1aa1);
  anon_unknown.dwarf_1d24e4::cmCTestSetTestsPropertiesCommand::cmCTestCommand(&local_1ad8,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestSetTestsPropertiesCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_1ac8,&local_1ad8);
  cmState::AddBuiltinCommand(pcVar7,&local_1aa0,&local_1ac8);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_1ac8);
  anon_unknown.dwarf_1d24e4::cmCTestSetTestsPropertiesCommand::~cmCTestSetTestsPropertiesCommand
            (&local_1ad8);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::allocator<char>::~allocator(&local_1aa1);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1af8,"set_directory_properties",&local_1af9);
  cmState::RemoveBuiltinCommand(pcVar7,&local_1af8);
  std::__cxx11::string::~string((string *)&local_1af8);
  std::allocator<char>::~allocator(&local_1af9);
  pcVar7 = cmake::GetState((cmake *)local_a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b20,"set_directory_properties",&local_1b21);
  anon_unknown.dwarf_1d24e4::cmCTestSetDirectoryPropertiesCommand::cmCTestCommand
            ((cmCTestSetDirectoryPropertiesCommand *)&testFilename,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_1b48,(cmCTestSetDirectoryPropertiesCommand *)&testFilename);
  cmState::AddBuiltinCommand(pcVar7,&local_1b20,&local_1b48);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_1b48);
  anon_unknown.dwarf_1d24e4::cmCTestSetDirectoryPropertiesCommand::
  ~cmCTestSetDirectoryPropertiesCommand((cmCTestSetDirectoryPropertiesCommand *)&testFilename);
  std::__cxx11::string::~string((string *)&local_1b20);
  std::allocator<char>::~allocator(&local_1b21);
  bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (bVar2) {
    local_1b60 = "CTestTestfile.cmake";
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    if (!bVar2) {
      this_local._7_1_ = true;
      goto LAB_0022c962;
    }
    local_1b60 = "DartTestfile.txt";
  }
  pcVar5 = local_1b60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b88,pcVar5,(allocator<char> *)((long)&specFile.Value + 7));
  bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1988,&local_1b88);
  std::__cxx11::string::~string((string *)&local_1b88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&specFile.Value + 7));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1bb8,"CTEST_RESOURCE_SPEC_FILE",&local_1bb9);
      local_1b98 = cmMakefile::GetDefinition((cmMakefile *)local_1988,&local_1bb8);
      std::__cxx11::string::~string((string *)&local_1bb8);
      std::allocator<char>::~allocator(&local_1bb9);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        bVar2 = cmValue::operator_cast_to_bool(&local_1b98);
        if (bVar2) {
          psVar6 = cmValue::operator*[abi_cxx11_(&local_1b98);
          std::__cxx11::string::operator=((string *)&this->ResourceSpecFile,(string *)psVar6);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d38);
      poVar4 = std::operator<<((ostream *)local_1d38,"Done constructing a list of tests");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x72b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_1d58);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d38);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0022c962:
  local_1b64 = 1;
  cmMakefile::~cmMakefile((cmMakefile *)local_1988);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_a38);
  return this_local._7_1_;
}

Assistant:

bool cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp);
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  mf.AddDefinition("CTEST_CONFIGURATION_TYPE", this->CTest->GetConfigType());

  // Add handler for ADD_TEST
  cm.GetState()->AddBuiltinCommand("add_test", cmCTestAddTestCommand(this));

  // Add handler for SUBDIRS
  cm.GetState()->AddBuiltinCommand("subdirs", cmCTestSubdirCommand);

  // Add handler for ADD_SUBDIRECTORY
  cm.GetState()->AddBuiltinCommand("add_subdirectory",
                                   cmCTestAddSubdirectoryCommand);

  // Add handler for SET_TESTS_PROPERTIES
  cm.GetState()->AddBuiltinCommand("set_tests_properties",
                                   cmCTestSetTestsPropertiesCommand(this));

  // Add handler for SET_DIRECTORY_PROPERTIES
  cm.GetState()->RemoveBuiltinCommand("set_directory_properties");
  cm.GetState()->AddBuiltinCommand("set_directory_properties",
                                   cmCTestSetDirectoryPropertiesCommand(this));

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return true;
  }

  if (!mf.ReadListFile(testFilename)) {
    return false;
  }
  if (cmSystemTools::GetErrorOccurredFlag()) {
    // SEND_ERROR or FATAL_ERROR in CTestTestfile or TEST_INCLUDE_FILES
    return false;
  }
  cmValue specFile = mf.GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && specFile) {
    this->ResourceSpecFile = *specFile;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
  return true;
}